

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Gia_ManDupWithFaddBoxes_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vFadds,Vec_Int_t *vMap,
               Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  if (pObj->Value == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x2de,
                    "void Gia_ManDupWithFaddBoxes_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
    if ((iVar4 < 0) || (vMap2Chain->nSize <= iVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Gia_ManDupWithFaddBoxes_rec(pNew,p,pObj + -(ulong)uVar3,vFadds,vMap,vChains,vMap2Chain,vTruths);
    Gia_ManDupWithFaddBoxes_rec
              (pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vFadds,vMap,vChains,
               vMap2Chain,vTruths);
    uVar2 = *(ulong *)pObj;
    if (((int)pObj[-(uVar2 & 0x1fffffff)].Value < 0) ||
       (uVar3 = (uint)(uVar2 >> 0x20), (int)pObj[-(ulong)(uVar3 & 0x1fffffff)].Value < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf5,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = Gia_ManAppendAnd(pNew,(uint)(uVar2 >> 0x1d) & 1 ^ pObj[-(uVar2 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
    pObj->Value = uVar3;
  }
  return;
}

Assistant:

void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    int iChain;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    iChain = Vec_IntEntry( vMap2Chain, Gia_ObjId(p, pObj) );
/*
    assert( iChain == -1 );
    if ( iChain >= 0 )
    {
        Gia_ManDupFadd( pNew, p, Vec_WecEntry(vChains, iChain), vFadds, vMap, vChains, vMap2Chain, vTruths );
        assert( ~pObj->Value );
        return;
    }
*/
    Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin0(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin1(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}